

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::ExpandListArgument
               (string *arg,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *newargs,bool emptyArgs)

{
  byte bVar1;
  long lVar2;
  undefined7 in_register_00000011;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  string newArg;
  value_type local_50;
  
  if (((int)CONCAT71(in_register_00000011,emptyArgs) == 0) && (arg->_M_string_length == 0)) {
    return;
  }
  iVar5 = 0;
  lVar2 = std::__cxx11::string::find((char)arg,0x3b);
  if (lVar2 == -1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(newargs,arg);
    return;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pbVar3 = (byte *)(arg->_M_dataplus)._M_p;
  pbVar4 = pbVar3;
  do {
    bVar1 = *pbVar3;
    if (bVar1 < 0x5c) {
      if (bVar1 == 0x3b) {
        if (iVar5 == 0) {
          std::__cxx11::string::append((char *)&local_50,(ulong)pbVar4);
          iVar5 = 0;
          pbVar4 = pbVar3 + 1;
          if ((char *)local_50._M_string_length != (char *)0x0 || emptyArgs) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(newargs,&local_50);
            iVar5 = 0;
            std::__cxx11::string::_M_replace
                      ((ulong)&local_50,0,(char *)local_50._M_string_length,0x53c2a5);
          }
        }
      }
      else if (bVar1 == 0x5b) {
        iVar5 = iVar5 + 1;
      }
      else if (bVar1 == 0) {
        std::__cxx11::string::append((char *)&local_50);
        if ((char *)local_50._M_string_length != (char *)0x0 || emptyArgs) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(newargs,&local_50);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return;
        }
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
        return;
      }
    }
    else if (bVar1 == 0x5c) {
      if (pbVar3[1] == 0x3b) {
        std::__cxx11::string::append((char *)&local_50,(ulong)pbVar4);
        pbVar3 = pbVar3 + 1;
        pbVar4 = pbVar3;
      }
    }
    else if (bVar1 == 0x5d) {
      iVar5 = iVar5 + -1;
    }
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

void cmSystemTools::ExpandListArgument(const std::string& arg,
                                       std::vector<std::string>& newargs,
                                       bool emptyArgs)
{
  // If argument is empty, it is an empty list.
  if(!emptyArgs && arg.empty())
    {
    return;
    }
  // if there are no ; in the name then just copy the current string
  if(arg.find(';') == std::string::npos)
    {
    newargs.push_back(arg);
    return;
    }
  std::string newArg;
  const char *last = arg.c_str();
  // Break the string at non-escaped semicolons not nested in [].
  int squareNesting = 0;
  for(const char* c = last; *c; ++c)
    {
    switch(*c)
      {
      case '\\':
        {
        // We only want to allow escaping of semicolons.  Other
        // escapes should not be processed here.
        const char* next = c + 1;
        if(*next == ';')
          {
          newArg.append(last, c - last);
          // Skip over the escape character
          last = c = next;
          }
        } break;
      case '[':
        {
        ++squareNesting;
        } break;
      case ']':
        {
        --squareNesting;
        } break;
      case ';':
        {
        // Break the string here if we are not nested inside square
        // brackets.
        if(squareNesting == 0)
          {
          newArg.append(last, c - last);
          // Skip over the semicolon
          last = c + 1;
          if ( !newArg.empty() || emptyArgs )
            {
            // Add the last argument if the string is not empty.
            newargs.push_back(newArg);
            newArg = "";
            }
          }
        } break;
      default:
        {
        // Just append this character.
        } break;
      }
    }
  newArg.append(last);
  if ( !newArg.empty() || emptyArgs )
    {
    // Add the last argument if the string is not empty.
    newargs.push_back(newArg);
    }
}